

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall
Potassco::AspifTextOutput::output(AspifTextOutput *this,StringSpan *str,LitSpan *cond)

{
  Atom_t AVar1;
  char *pcVar2;
  ulong uVar3;
  Atom_t atom;
  bool bVar4;
  int iVar5;
  Id_t x;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  string name;
  size_t ep;
  string local_58;
  ulong local_38;
  
  if (cond->size == 1) {
    pcVar2 = str->first;
    uVar3 = str->size;
    pcVar6 = pcVar2;
    if (uVar3 < 2) {
      uVar7 = 1;
      if (uVar3 == 0) goto LAB_0010b5e3;
    }
    else {
      uVar7 = uVar3;
      if (*pcVar2 == '-') {
        uVar7 = uVar3 - 1;
        pcVar6 = pcVar2 + 1;
      }
    }
    uVar8 = 0;
    do {
      if ((byte)pcVar6[uVar8] != 0x5f) {
        iVar5 = islower((uint)(byte)pcVar6[uVar8]);
        if (iVar5 != 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + uVar3)
          ;
          iVar5 = Data::atomArity(&local_58,&local_38);
          if ((iVar5 == 0) && (local_38 < local_58._M_string_length)) {
            std::__cxx11::string::resize((ulong)&local_58,(char)local_38);
          }
          AVar1 = *cond->first;
          atom = -AVar1;
          if (0 < (int)AVar1) {
            atom = AVar1;
          }
          bVar4 = assignAtomName(this,atom,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          if (bVar4) {
            return;
          }
        }
        break;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
LAB_0010b5e3:
  push(this,4);
  x = Data::addOutputString(this->data_,str);
  push(this,x);
  push(this,cond);
  return;
}

Assistant:

void AspifTextOutput::output(const StringSpan& str, const LitSpan& cond) {
	if (size(cond) == 1 && isAtom(str)) {
		std::string name(begin(str), end(str));
		std::size_t ep;
		if (Data::atomArity(name, &ep) == 0 && ep < name.size()) {
			name.resize(ep);
		}
		if (assignAtomName(atom(*begin(cond)), name))
			return;
	}
	push(Directive_t::Output).push(data_->addOutputString(str)).push(cond);
}